

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environ.cpp
# Opt level: O0

DWORD GetEnvironmentVariableW(LPCWSTR lpName,LPWSTR lpBuffer,DWORD nSize)

{
  int iVar1;
  DWORD local_38;
  DWORD size;
  INT inBuffSize;
  CHAR *outBuff;
  CHAR *inBuff;
  DWORD nSize_local;
  LPWSTR lpBuffer_local;
  LPCWSTR lpName_local;
  
  outBuff = (CHAR *)0x0;
  _size = (LPCSTR)0x0;
  local_38 = 0;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  iVar1 = WideCharToMultiByte(0,0,lpName,-1,(LPSTR)0x0,0,(LPCSTR)0x0,(LPBOOL)0x0);
  if (iVar1 == 0) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    SetLastError(0x57);
  }
  else {
    outBuff = (CHAR *)PAL_malloc((long)iVar1);
    if (outBuff == (LPCSTR)0x0) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      SetLastError(8);
    }
    else if ((nSize == 0) || (_size = (LPCSTR)PAL_malloc((ulong)(nSize << 1)), _size != (LPCSTR)0x0)
            ) {
      iVar1 = WideCharToMultiByte(0,0,lpName,-1,outBuff,iVar1,(LPCSTR)0x0,(LPBOOL)0x0);
      if (iVar1 == 0) {
        fprintf(_stderr,"] %s %s:%d","GetEnvironmentVariableW",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/misc/environ.cpp"
                ,0xb6);
        fprintf(_stderr,"WideCharToMultiByte failed!\n");
        SetLastError(0x54f);
      }
      else {
        local_38 = GetEnvironmentVariableA(outBuff,_size,nSize);
        if (nSize < local_38) {
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
        }
        else if (local_38 != 0) {
          iVar1 = MultiByteToWideChar(0,0,_size,-1,lpBuffer,nSize);
          if (iVar1 == 0) {
            fprintf(_stderr,"] %s %s:%d","GetEnvironmentVariableW",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/misc/environ.cpp"
                    ,0xcd);
            fprintf(_stderr,"MultiByteToWideChar failed!\n");
            SetLastError(0x54f);
            local_38 = 0;
            *lpBuffer = L'\0';
          }
          else {
            local_38 = iVar1 - 1;
          }
        }
      }
    }
    else {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      SetLastError(8);
    }
  }
  PAL_free(_size);
  PAL_free(outBuff);
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return local_38;
  }
  abort();
}

Assistant:

DWORD
PALAPI
GetEnvironmentVariableW(
            IN LPCWSTR lpName,
            OUT LPWSTR lpBuffer,
            IN DWORD nSize)
{
    CHAR *inBuff = NULL;
    CHAR *outBuff = NULL;
    INT inBuffSize;
    DWORD size = 0;

    PERF_ENTRY(GetEnvironmentVariableW);
    ENTRY("GetEnvironmentVariableW(lpName=%p (%S), lpBuffer=%p, nSize=%u)\n",
          lpName?lpName:W16_NULLSTRING,
          lpName?lpName:W16_NULLSTRING, lpBuffer, nSize);

    inBuffSize = WideCharToMultiByte( CP_ACP, 0, lpName, -1, 
                                      inBuff, 0, NULL, NULL);
    if ( 0 == inBuffSize )
    {
        ERROR( "lpName has to be a valid parameter\n" );
        SetLastError( ERROR_INVALID_PARAMETER );
        goto done;
    }

    inBuff = (CHAR *)PAL_malloc(inBuffSize);
    if (inBuff == NULL)
    {
        ERROR("malloc failed\n");
        SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        goto done;
    }
    
    if (nSize) {
        outBuff = (CHAR *)PAL_malloc(nSize*2);
        if (outBuff == NULL)
        {
            ERROR("malloc failed\n");
            SetLastError(ERROR_NOT_ENOUGH_MEMORY);
            goto done;
        }
    }

    if ( 0 == WideCharToMultiByte( CP_ACP, 0, lpName, -1, inBuff, 
                                   inBuffSize, NULL, NULL ) )
    {
        ASSERT( "WideCharToMultiByte failed!\n" );
        SetLastError( ERROR_INTERNAL_ERROR );
        goto done;
    }
    size = GetEnvironmentVariableA(inBuff, outBuff, nSize);
    if (size > nSize)
    {
        TRACE("Insufficient buffer\n");
    }
    else if ( size == 0 )
    {
        /* error handle in GetEnvironmentVariableA */
    }
    else
    {
        size = MultiByteToWideChar(CP_ACP, 0, outBuff, -1, lpBuffer, nSize);
        if ( 0 != size )
        {
            /* Not including the NULL. */
            size--;
        }
        else
        {
            ASSERT( "MultiByteToWideChar failed!\n" );
            SetLastError( ERROR_INTERNAL_ERROR );
            size = 0;
            *lpBuffer = '\0';
        }
    }

done:
    PAL_free(outBuff);
    PAL_free(inBuff);

    LOGEXIT("GetEnvironmentVariableW returns DWORD 0x%x\n", size);
    PERF_EXIT(GetEnvironmentVariableW);
    return size;
}